

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_bitset_container_intersection_cardinality(run_container_t *src_1,bitset_container_t *src_2)

{
  _Bool _Var1;
  int iVar2;
  int local_28;
  rle16_t rle;
  int32_t rlepos;
  int answer;
  bitset_container_t *src_2_local;
  run_container_t *src_1_local;
  
  _Var1 = run_container_is_full(src_1);
  if (_Var1) {
    src_1_local._4_4_ = (rle16_t)bitset_container_cardinality(src_2);
  }
  else {
    rle.value = 0;
    rle.length = 0;
    for (local_28 = 0; local_28 < src_1->n_runs; local_28 = local_28 + 1) {
      iVar2 = bitset_lenrange_cardinality
                        (src_2->words,(uint)src_1->runs[local_28] & 0xffff,
                         (uint)src_1->runs[local_28] >> 0x10);
      rle = (rle16_t)(iVar2 + (int)rle);
    }
    src_1_local._4_4_ = rle;
  }
  iVar2._0_2_ = src_1_local._4_2_;
  iVar2._2_2_ = src_1_local._6_2_;
  return iVar2;
}

Assistant:

int run_bitset_container_intersection_cardinality(
    const run_container_t *src_1, const bitset_container_t *src_2) {
    if (run_container_is_full(src_1)) {
        return bitset_container_cardinality(src_2);
    }
    int answer = 0;
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        answer +=
            bitset_lenrange_cardinality(src_2->words, rle.value, rle.length);
    }
    return answer;
}